

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,char **strpos
               )

{
  char cVar1;
  uint uVar2;
  int src_node_00;
  undefined8 uVar3;
  char *pcVar4;
  XML_Content *pXVar5;
  long lVar6;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  
  lVar9 = *(long *)((long)parser + 0x3a8);
  lVar6 = (long)src_node * 0x20;
  uVar3 = *(undefined8 *)(lVar9 + lVar6);
  dest->type = (int)uVar3;
  dest->quant = (int)((ulong)uVar3 >> 0x20);
  if ((int)uVar3 == 4) {
    dest->name = *strpos;
    pcVar7 = *(char **)(lVar9 + 8 + lVar6);
    do {
      cVar1 = *pcVar7;
      pcVar4 = *strpos;
      *strpos = pcVar4 + 1;
      *pcVar4 = cVar1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lVar9 = 0x18;
  }
  else {
    uVar2 = *(uint *)(lVar9 + 0x18 + lVar6);
    dest->numchildren = uVar2;
    pXVar5 = *contpos;
    dest->children = pXVar5;
    *contpos = pXVar5 + uVar2;
    lVar9 = 8;
    if ((ulong)uVar2 != 0) {
      piVar8 = (int *)(lVar6 + *(long *)((long)parser + 0x3a8) + 0x10);
      lVar9 = 0;
      uVar10 = 0;
      do {
        src_node_00 = *piVar8;
        build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar9),contpos,
                   strpos);
        uVar10 = uVar10 + 1;
        piVar8 = (int *)(*(long *)((long)parser + 0x3a8) + (long)src_node_00 * 0x20 + 0x1c);
        lVar9 = lVar9 + 0x20;
      } while (uVar10 < dest->numchildren);
      lVar9 = 8;
    }
  }
  *(undefined8 *)((long)&dest->type + lVar9) = 0;
  return;
}

Assistant:

static void
build_node (XML_Parser parser,
            int src_node,
            XML_Content *dest,
            XML_Content **contpos,
            char **strpos)
{
  dest->type = dtd.scaffold[src_node].type;
  dest->quant = dtd.scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const char *src;
    dest->name = *strpos;
    src = dtd.scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (! *src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = 0;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd.scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd.scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd.scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = 0;
  }
}